

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

ElementPtr __thiscall Rml::Element::Clone(Element *this)

{
  String *instancer_name;
  XMLAttributes *attributes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  _func_int **pp_Var3;
  NodePtr pDVar4;
  _func_int *p_Var5;
  ulong uVar6;
  _Alloc_hider _Var7;
  ulong *puVar8;
  PropertyMap *this_00;
  ulong uVar10;
  long *in_RSI;
  uint8_t *puVar11;
  ulong *puVar12;
  pair<Rml::PropertyId,_Rml::Property> *id_property;
  const_iterator cVar13;
  String inner_rml;
  ElementAttributes clone_attributes;
  String local_60;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_40;
  NodePtr pDVar9;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
  plVar2 = (long *)in_RSI[0xf];
  instancer_name = (String *)(in_RSI + 7);
  attributes = (XMLAttributes *)(in_RSI + 0x14);
  if (plVar2 == (long *)0x0) {
    Factory::InstanceElement
              ((Factory *)&local_60,(Element *)0x0,instancer_name,instancer_name,attributes);
    _Var7._M_p = local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
    pp_Var3 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable;
    (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)_Var7._M_p;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 0x10))();
    }
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x10))();
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(&local_60,plVar2,0,instancer_name,attributes);
    _Var7._M_p = local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
    pp_Var3 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable;
    (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)_Var7._M_p;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 0x10))();
    }
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60._M_dataplus._M_p + 0x10))();
    }
    pp_Var3 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable;
    if ((pp_Var3 != (_func_int **)0x0) && (pp_Var3[0xf] == (_func_int *)0x0)) {
      pp_Var3[0xf] = (_func_int *)in_RSI[0xf];
    }
  }
  if ((this->super_ScriptInterface).super_Releasable._vptr_Releasable != (_func_int **)0x0) {
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::vector(&local_40.m_container,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
              *)attributes);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>(&local_40,(char (*) [6])0x2df1ec);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::erase<char[6]>(&local_40,(char (*) [6])"class");
    SetAttributes((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,
                  &local_40);
    this_00 = ElementStyle::GetLocalStyleProperties((ElementStyle *)(in_RSI[0x30] + 0x38));
    cVar13 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(this_00);
    pDVar9 = cVar13.mKeyVals;
    pDVar4 = (NodePtr)this_00->mInfo;
    while (pDVar9 != pDVar4) {
      puVar11 = cVar13.mInfo;
      pDVar9 = cVar13.mKeyVals;
      ElementStyle::SetProperty
                ((ElementStyle *)
                 ((this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x30] + 0x38),
                 (pDVar9->mData).first,&(pDVar9->mData).second);
      pDVar9 = pDVar9 + 1;
      uVar10 = *(ulong *)(puVar11 + 1);
      if (uVar10 == 0) {
        puVar8 = (ulong *)(puVar11 + 9);
        do {
          puVar12 = puVar8;
          pDVar9 = pDVar9 + 8;
          uVar10 = *puVar12;
          puVar8 = puVar12 + 1;
        } while (uVar10 == 0);
      }
      else {
        puVar12 = (ulong *)(puVar11 + 1);
      }
      uVar6 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar10 = uVar6 >> 3 & 0x1fffffff;
      pDVar9 = pDVar9 + uVar10;
      cVar13.mInfo = (uint8_t *)((long)puVar12 + uVar10);
      cVar13.mKeyVals = pDVar9;
    }
    p_Var5 = (this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x30];
    ElementStyle::GetClassNames_abi_cxx11_(&local_60,(ElementStyle *)(in_RSI[0x30] + 0x38));
    ElementStyle::SetClassNames((ElementStyle *)(p_Var5 + 0x38),&local_60);
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)paVar1;
    (**(code **)(*in_RSI + 0x40))();
    SetInnerRML((Element *)(this->super_ScriptInterface).super_Releasable._vptr_Releasable,&local_60
               );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_40.m_container);
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::Clone() const
{
	ElementPtr clone;

	if (instancer)
	{
		clone = instancer->InstanceElement(nullptr, GetTagName(), attributes);
		if (clone)
			clone->SetInstancer(instancer);
	}
	else
		clone = Factory::InstanceElement(nullptr, GetTagName(), GetTagName(), attributes);

	if (clone)
	{
		// Copy over the attributes. The 'style' and 'class' attributes are skipped because inline styles and class names are copied manually below.
		// This is necessary in case any properties or classes have been set manually, in which case the 'style' and 'class' attributes are out of
		// sync with the used style and active classes.
		ElementAttributes clone_attributes = attributes;
		clone_attributes.erase("style");
		clone_attributes.erase("class");
		clone->SetAttributes(clone_attributes);

		for (auto& id_property : GetStyle()->GetLocalStyleProperties())
			clone->SetProperty(id_property.first, id_property.second);

		clone->GetStyle()->SetClassNames(GetStyle()->GetClassNames());

		String inner_rml;
		GetInnerRML(inner_rml);

		clone->SetInnerRML(inner_rml);
	}

	return clone;
}